

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_regset.c
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  FILE *pFVar3;
  ulong uVar4;
  undefined8 uVar5;
  char *end;
  int in_stack_ffffffffffffffb8;
  int iVar6;
  char *s;
  char *pcVar7;
  OnigEncoding use_encs [1];
  size_t n;
  
  onig_initialize();
  srand(0x3039);
  XX_LEAD = 0;
  xx(0x19b,0,(char **)0x0," abab bccab ca",0,0,0,1,in_stack_ffffffffffffffb8);
  xx(0x19c,3,p1," abab bccab ca",8,0xb,0,0,in_stack_ffffffffffffffb8);
  xx(0x19d,3,p1," abab bccab ca",8,0xb,1,0,in_stack_ffffffffffffffb8);
  xx(0x19e,3,p2," XXXX AAA 1223 012345678bbb",0,0,0,1,in_stack_ffffffffffffffb8);
  xx(0x19f,3,p2,"0123456789",9,10,0,0,in_stack_ffffffffffffffb8);
  xx(0x1a0,10,p7,"abcde 555 qwert",6,9,0,0,in_stack_ffffffffffffffb8);
  xx(0x1a1,2,p8,"",0,0,0,0,in_stack_ffffffffffffffb8);
  XX_LEAD = 1;
  xx(0x1a5,0,(char **)0x0," abab bccab ca",0,0,0,1,in_stack_ffffffffffffffb8);
  xx(0x1a6,3,p1," abab bccab ca",8,0xb,0,0,in_stack_ffffffffffffffb8);
  xx(0x1a7,3,p1," abab bccab ca",8,0xb,1,0,in_stack_ffffffffffffffb8);
  xx(0x1a8,3,p2," XXXX AAA 1223 012345678bbb",0,0,0,1,in_stack_ffffffffffffffb8);
  xx(0x1a9,3,p2,"0123456789",9,10,0,0,in_stack_ffffffffffffffb8);
  xx(0x1aa,10,p7,"abcde 555 qwert",6,9,0,0,in_stack_ffffffffffffffb8);
  pFVar3 = fopen("kofu-utf8.txt","r");
  if (pFVar3 != (FILE *)0x0) {
    n = 0;
    s = (char *)0x0;
    uVar4 = getdelim((char **)&stack0xffffffffffffffb8,&n,-1,pFVar3);
    fclose(pFVar3);
    if (-1 < (long)uVar4) {
      end = s + uVar4;
      pcVar7 = s;
      fprintf(_stdout,"FILE: %s, size: %d\n","kofu-utf8.txt",uVar4 & 0xffffffff);
      iVar6 = (int)pcVar7;
      xx(0x1b8,3,p2,s,10,0x16,0,0,iVar6);
      xx(0x1b9,4,p3,s,0x791cf,0x791d8,0,0,iVar6);
      xx(0x1ba,0x10,p4,s,0x50e,0x523,0,0,iVar6);
      pFVar3 = _stdout;
      iVar2 = nerror;
      iVar1 = nfail;
      iVar6 = nsucc;
      uVar5 = onig_version();
      fprintf(pFVar3,"\nRESULT   SUCC: %4d,  FAIL: %d,  ERROR: %d      (by Oniguruma %s)\n",
              (ulong)(uint)iVar6,(ulong)(uint)iVar1,(ulong)(uint)iVar2,uVar5);
      fputc(10,_stdout);
      time_compare(3,p2,s,end);
      time_compare(4,p3,s,end);
      time_compare(0x10,p4,s,end);
      time_compare(0xe,p5,s,end);
      time_compare(5,p6,s,end);
      fputc(10,_stdout);
      free(s);
      goto LAB_001027f6;
    }
  }
  fprintf(_stdout,"Ignore %s\n","kofu-utf8.txt");
  pFVar3 = _stdout;
  iVar2 = nerror;
  iVar1 = nfail;
  iVar6 = nsucc;
  uVar5 = onig_version();
  fprintf(pFVar3,"\nRESULT   SUCC: %4d,  FAIL: %d,  ERROR: %d      (by Oniguruma %s)\n",
          (ulong)(uint)iVar6,(ulong)(uint)iVar1,(ulong)(uint)iVar2,uVar5);
LAB_001027f6:
  onig_end();
  return -(uint)(nerror != 0 || nfail != 0);
}

Assistant:

extern int
main(int argc, char* argv[])
{
#ifndef _WIN32
  int file_exist;
#endif
  int r;
  char *s, *end;
  OnigEncoding use_encs[1];

  use_encs[0] = ONIG_ENCODING_UTF8;
  onig_initialize(use_encs, sizeof(use_encs)/sizeof(use_encs[0]));

  srand(12345);

  XX_LEAD = ONIG_REGSET_POSITION_LEAD;

  NZERO(" abab bccab ca");
  X2(p1, " abab bccab ca", 8, 11);
  X3(p1, " abab bccab ca", 8, 11, 1);
  N(p2, " XXXX AAA 1223 012345678bbb");
  X2(p2, "0123456789", 9, 10);
  X2(p7, "abcde 555 qwert", 6, 9);
  X2(p8, "", 0, 0);

  XX_LEAD = ONIG_REGSET_REGEX_LEAD;

  NZERO(" abab bccab ca");
  X2(p1, " abab bccab ca", 8, 11);
  X3(p1, " abab bccab ca", 8, 11, 1);
  N(p2, " XXXX AAA 1223 012345678bbb");
  X2(p2, "0123456789", 9, 10);
  X2(p7, "abcde 555 qwert", 6, 9);

#ifndef _WIN32
  r = get_all_content_of_file(TEXT_PATH, &s, &end);
  if (r == 0) {
    fprintf(stdout, "FILE: %s, size: %d\n", TEXT_PATH, (int )(end - s));
    file_exist = 1;
  }
  else {
    fprintf(stdout, "Ignore %s\n", TEXT_PATH);
    file_exist = 0;
  }

  if (file_exist != 0) {
    X2(p2, s, 10, 22);
    X2(p3, s, 496079, 496088);
    X2(p4, s, 1294, 1315);
  }
#endif

  fprintf(stdout,
          "\nRESULT   SUCC: %4d,  FAIL: %d,  ERROR: %d      (by Oniguruma %s)\n",
          nsucc, nfail, nerror, onig_version());

#ifndef _WIN32
  if (file_exist != 0) {
    fprintf(stdout, "\n");
    time_compare(ASIZE(p2), p2, s, end);
    time_compare(ASIZE(p3), p3, s, end);
    time_compare(ASIZE(p4), p4, s, end);
    time_compare(ASIZE(p5), p5, s, end);
    time_compare(ASIZE(p6), p6, s, end);
    fprintf(stdout, "\n");
    free(s);
  }
#endif

  onig_end();

  return ((nfail == 0 && nerror == 0) ? 0 : -1);
}